

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadHeap.cpp
# Opt level: O3

void __thiscall QuadHeap::QuadHeap(QuadHeap *this,void **vtt)

{
  Drawable DVar1;
  void *pvVar2;
  
  Entity::Entity(&this->super_Entity,vtt + 1,Vec2d::ORIGIN,Vec2d::ORIGIN);
  DVar1 = *(Drawable *)(vtt + 3);
  this->super_Drawable = DVar1;
  *(void **)(&((Drawable *)(this->quadState + -2))->field_0x0 + *(long *)((long)DVar1 + -0x50)) =
       vtt[4];
  (this->super_Collidable)._vptr_Collidable = (_func_int **)&PTR___cxa_pure_virtual_001306d8;
  pvVar2 = *vtt;
  *(void **)&this->super_Entity = pvVar2;
  *(void **)((long)(this->quadState + -4) + 8 + *(long *)((long)pvVar2 + -0x50)) = vtt[5];
  this->super_Drawable = *(Drawable *)(vtt + 6);
  (this->super_Collidable)._vptr_Collidable = (_func_int **)&PTR_collidesWithQuads_00130448;
  memset(&this->quads,0,0xe0);
  return;
}

Assistant:

QuadHeap::QuadHeap(): Entity(Vec2d::ORIGIN, Vec2d::ORIGIN) {
    quads = vector<Quad*>();
    
    for (int x=0; x<10; x++) {
        for (int y=0; y<20; y++) {
            quadState[x][y] = false;
        }
    }
}